

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O0

FileName * __thiscall embree::FileName::dropExt(FileName *this)

{
  string *in;
  FileName *in_RSI;
  FileName *in_RDI;
  size_t pos;
  string local_38 [32];
  FileName *this_00;
  
  this_00 = in_RSI;
  in = (string *)std::__cxx11::string::find_last_of((char)in_RSI,0x2e);
  if (in == (string *)0xffffffffffffffff) {
    FileName(this_00,(string *)0xffffffffffffffff);
  }
  else {
    std::__cxx11::string::substr((ulong)local_38,(ulong)in_RSI);
    FileName(this_00,in);
    std::__cxx11::string::~string(local_38);
  }
  return in_RDI;
}

Assistant:

FileName FileName::dropExt() const {
    size_t pos = filename.find_last_of('.');
    if (pos == std::string::npos) return filename;
    return filename.substr(0,pos);
  }